

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void transform_test(png_modifier *pmIn,png_uint_32 idIn,image_transform *transform_listIn,char *name
                   )

{
  jmp_buf *pa_Var1;
  int iVar2;
  char local_738 [8];
  char full_name [256];
  png_infop local_630;
  png_infop pi;
  png_structp pp;
  size_t pos;
  jmp_buf exception__env;
  jmp_buf *exception__prev;
  png_store *fault;
  exception_context *the_exception_context;
  transform_display d;
  char *name_local;
  image_transform *transform_listIn_local;
  png_uint_32 idIn_local;
  png_modifier *pmIn_local;
  
  d.srgb_mod._32_8_ = name;
  transform_display_init((transform_display *)&the_exception_context,pmIn,idIn,transform_listIn);
  pa_Var1 = (pmIn->this).exception_context.penv;
  (pmIn->this).exception_context.penv = (jmp_buf *)&pos;
  iVar2 = _setjmp((__jmp_buf_tag *)&pos);
  if (iVar2 == 0) {
    do {
      pp = (png_structp)0x0;
      transform_set_encoding(&the_exception_context);
      (**(code **)((d.pm)->this).options)(d.pm,&the_exception_context);
      pp = (png_structp)safecat(local_738,0x100,(size_t)pp,(char *)d.srgb_mod._32_8_);
      pp = (png_structp)
           safecat_current_encoding(local_738,0x100,(size_t)pp,(png_modifier *)d.this._1104_8_);
      pi = (png_infop)
           set_modifier_for_read((png_modifier *)d.this._1104_8_,&local_630,d.this._8_4_,local_738);
      standard_palette_init((standard_display *)&the_exception_context);
      if ((*(byte *)(d.this._1104_8_ + 0x18) >> 6 & 1) == 0) {
        png_set_read_fn(pi,d.this._1104_8_,modifier_read);
        png_read_info(pi,local_630);
        transform_info_imp((transform_display *)&the_exception_context,(png_structp)pi,local_630);
        sequential_row((standard_display *)&the_exception_context,(png_structp)pi,local_630,-1,0);
        if (d.this.is_transparent == 0) {
          transform_image_validate
                    ((transform_display *)&the_exception_context,(png_const_structp)pi,local_630);
        }
        else {
          *(byte *)&the_exception_context[1].penv =
               *(byte *)&the_exception_context[1].penv & 0x7f | 0x80;
        }
      }
      else {
        png_set_progressive_read_fn(pi,&the_exception_context,transform_info,progressive_row);
        modifier_progressive_read((png_modifier *)d.this._1104_8_,(png_structp)pi,local_630);
      }
      modifier_reset((png_modifier *)d.this._1104_8_);
      (pmIn->this).exception_context.caught = 0;
    } while ((pmIn->this).exception_context.caught != 0);
  }
  else {
    (pmIn->this).exception_context.caught = 1;
  }
  (pmIn->this).exception_context.penv = pa_Var1;
  if ((pmIn->this).exception_context.caught != 0) {
    modifier_reset((png_modifier *)(pmIn->this).exception_context.v.etmp);
  }
  return;
}

Assistant:

static void
transform_test(png_modifier *pmIn, png_uint_32 idIn,
    const image_transform* transform_listIn, const char * const name)
{
   transform_display d;
   context(&pmIn->this, fault);

   transform_display_init(&d, pmIn, idIn, transform_listIn);

   Try
   {
      size_t pos = 0;
      png_structp pp;
      png_infop pi;
      char full_name[256];

      /* Make sure the encoding fields are correct and enter the required
       * modifications.
       */
      transform_set_encoding(&d);

      /* Add any modifications required by the transform list. */
      d.transform_list->ini(d.transform_list, &d);

      /* Add the color space information, if any, to the name. */
      pos = safecat(full_name, sizeof full_name, pos, name);
      pos = safecat_current_encoding(full_name, sizeof full_name, pos, d.pm);

      /* Get a png_struct for reading the image. */
      pp = set_modifier_for_read(d.pm, &pi, d.this.id, full_name);
      standard_palette_init(&d.this);

#     if 0
         /* Logging (debugging only) */
         {
            char buffer[256];

            (void)store_message(&d.pm->this, pp, buffer, sizeof buffer, 0,
               "running test");

            fprintf(stderr, "%s\n", buffer);
         }
#     endif

      /* Introduce the correct read function. */
      if (d.pm->this.progressive)
      {
         /* Share the row function with the standard implementation. */
         png_set_progressive_read_fn(pp, &d, transform_info, progressive_row,
            transform_end);

         /* Now feed data into the reader until we reach the end: */
         modifier_progressive_read(d.pm, pp, pi);
      }
      else
      {
         /* modifier_read expects a png_modifier* */
         png_set_read_fn(pp, d.pm, modifier_read);

         /* Check the header values: */
         png_read_info(pp, pi);

         /* Process the 'info' requirements. Only one image is generated */
         transform_info_imp(&d, pp, pi);

         sequential_row(&d.this, pp, pi, -1, 0);

         if (!d.this.speed)
            transform_image_validate(&d, pp, pi);
         else
            d.this.ps->validated = 1;
      }

      modifier_reset(d.pm);
   }

   Catch(fault)
   {
      modifier_reset(voidcast(png_modifier*,(void*)fault));
   }
}